

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_constraints.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::DuckDBConstraintsInit(ClientContext *context,TableFunctionInitInput *input)

{
  long lVar1;
  pointer prVar2;
  _Head_base<0UL,_duckdb::DuckDBConstraintsData_*,_false> _Var3;
  pointer prVar4;
  ulong uVar5;
  pointer pDVar6;
  pointer prVar7;
  reference_wrapper<duckdb::CatalogEntry> *entry;
  pointer prVar8;
  __normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>_*,_std::vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>_>
  __i;
  long lVar9;
  pointer prVar10;
  _Head_base<0UL,_duckdb::DuckDBConstraintsData_*,_false> local_a0;
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_true> entries;
  vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_true> schemas;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  make_uniq<duckdb::DuckDBConstraintsData>();
  Catalog::GetAllSchemas(&schemas,(ClientContext *)input);
  for (prVar7 = schemas.
                super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_head_impl = local_a0._M_head_impl,
      prVar7 != schemas.
                super_vector<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; prVar7 = prVar7 + 1) {
    entries.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    entries.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    entries.
    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_50._8_8_ = 0;
    local_38 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_constraints.cpp:105:56)>
               ::_M_invoke;
    local_40 = ::std::
               _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/function/table/system/duckdb_constraints.cpp:105:56)>
               ::_M_manager;
    local_50._M_unused._M_object =
         (_Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
          *)&entries;
    (*(prVar7->_M_data->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
              (prVar7->_M_data,input,1,&local_50);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_50);
    prVar4 = entries.
             super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    prVar8 = entries.
             super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    prVar2 = entries.
             super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             .
             super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (entries.
        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        entries.
        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar9 = (long)entries.
                    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)entries.
                    super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = lVar9 >> 3;
      lVar1 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      ::std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                (entries.
                 super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 entries.
                 super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar9 < 0x81) {
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                  (prVar8,prVar4);
        prVar8 = entries.
                 super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        prVar2 = entries.
                 super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 .
                 super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        prVar10 = prVar8 + 0x10;
        ::std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                  (prVar8,prVar10);
        for (; prVar8 = entries.
                        super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                        .
                        super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
            prVar2 = entries.
                     super_vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     .
                     super__Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish, prVar10 != prVar4;
            prVar10 = prVar10 + 1) {
          ::std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::reference_wrapper<duckdb::CatalogEntry>*,std::vector<std::reference_wrapper<duckdb::CatalogEntry>,std::allocator<std::reference_wrapper<duckdb::CatalogEntry>>>>,__gnu_cxx::__ops::_Val_comp_iter<duckdb::DuckDBConstraintsInit(duckdb::ClientContext&,duckdb::TableFunctionInitInput&)::__1>>
                    (prVar10);
        }
      }
    }
    for (; prVar8 != prVar2; prVar8 = prVar8 + 1) {
      pDVar6 = unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
               ::operator->((unique_ptr<duckdb::DuckDBConstraintsData,_std::default_delete<duckdb::DuckDBConstraintsData>,_true>
                             *)&local_a0);
      ::std::vector<duckdb::ConstraintEntry,std::allocator<duckdb::ConstraintEntry>>::
      emplace_back<duckdb::ClientContext&,duckdb::TableCatalogEntry&>
                ((vector<duckdb::ConstraintEntry,std::allocator<duckdb::ConstraintEntry>> *)
                 &pDVar6->entries,(ClientContext *)input,(TableCatalogEntry *)prVar8->_M_data);
    }
    ::std::
    _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
    ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                     *)&entries);
  }
  local_a0._M_head_impl = (DuckDBConstraintsData *)0x0;
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var3._M_head_impl;
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>_>
                   *)&schemas);
  if (local_a0._M_head_impl != (DuckDBConstraintsData *)0x0) {
    (*((local_a0._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState[1])()
    ;
  }
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> DuckDBConstraintsInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<DuckDBConstraintsData>();

	// scan all the schemas for tables and collect them
	auto schemas = Catalog::GetAllSchemas(context);

	for (auto &schema : schemas) {
		vector<reference<CatalogEntry>> entries;

		schema.get().Scan(context, CatalogType::TABLE_ENTRY, [&](CatalogEntry &entry) {
			if (entry.type == CatalogType::TABLE_ENTRY) {
				entries.push_back(entry);
			}
		});

		sort(entries.begin(), entries.end(), [&](CatalogEntry &x, CatalogEntry &y) { return (x.name < y.name); });
		for (auto &entry : entries) {
			result->entries.emplace_back(context, entry.get().Cast<TableCatalogEntry>());
		}
	};

	return std::move(result);
}